

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_channel
ma_channel_map_init_standard_channel
          (ma_standard_channel_map standardChannelMap,ma_uint32 channelCount,ma_uint32 channelIndex)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  
  if (channelCount <= channelIndex) {
    return '\0';
  }
  cVar1 = (char)channelIndex;
  switch(standardChannelMap) {
  case ma_standard_channel_map_alsa:
    switch(channelCount) {
    case 1:
switchD_00165dd2_caseD_1:
      return '\x01';
    case 2:
switchD_00165dd2_caseD_2:
      if (channelIndex == 0) {
        return '\x02';
      }
      if (channelIndex == 1) {
        return '\x03';
      }
      break;
    case 3:
switchD_00165dd2_caseD_3:
      if (channelIndex < 3) {
LAB_00165e16:
        return cVar1 + '\x02';
      }
      break;
    case 4:
switchD_00165d06_caseD_4:
      if (3 < channelIndex) break;
LAB_00165ed6:
      bVar2 = (byte)(channelIndex << 3);
      uVar3 = 0x7060302;
LAB_00165f53:
      return (ma_channel)(uVar3 >> (bVar2 & 0x1f));
    case 5:
      if (4 < channelIndex) break;
LAB_00165ebf:
      bVar2 = (byte)(channelIndex << 3);
      uVar4 = 0x407060302;
LAB_00165f94:
      return (ma_channel)(uVar4 >> (bVar2 & 0x3f));
    case 6:
      if (5 < channelIndex) break;
LAB_00165f5f:
      bVar2 = (byte)(channelIndex << 3);
      uVar4 = 0x50407060302;
      goto LAB_00165f94;
    case 7:
      if (6 < channelIndex) break;
      bVar2 = (byte)(channelIndex << 3);
      uVar4 = 0xa050407060302;
      goto LAB_00165f94;
    default:
      if (channelIndex < 8) {
        bVar2 = (byte)(channelIndex << 3);
        uVar4 = 0xc0b050407060302;
        goto LAB_00165f94;
      }
    }
LAB_00165f9c:
    if (0x1f < channelIndex || channelCount < 9) {
      return '\0';
    }
    return cVar1 + '\f';
  case ma_standard_channel_map_rfc3551:
    switch(channelCount) {
    case 1:
      goto switchD_00165dd2_caseD_1;
    case 2:
      goto switchD_00165da8_caseD_2;
    case 3:
switchD_00165da8_caseD_3:
      if (2 < channelIndex) goto LAB_00165efc;
      goto LAB_00165e16;
    case 4:
      if (3 < channelIndex) goto LAB_00165efc;
LAB_00165f4b:
      bVar2 = (byte)(channelIndex << 3);
      uVar3 = 0xa040302;
      goto LAB_00165f53;
    case 5:
      if (4 < channelIndex) goto LAB_00165efc;
LAB_00165ea8:
      bVar2 = (byte)(channelIndex << 3);
      uVar4 = 0x706040302;
      goto LAB_00165f94;
    default:
      if (channelIndex < 6) {
        bVar2 = (byte)(channelIndex << 3);
        uVar4 = 0xa0c03040b02;
        goto LAB_00165f94;
      }
      goto LAB_00165efc;
    }
  case ma_standard_channel_map_flac:
    switch(channelCount) {
    case 1:
      goto switchD_00165dd2_caseD_1;
    case 2:
      goto switchD_00165dd2_caseD_2;
    case 3:
      goto switchD_00165dd2_caseD_3;
    case 4:
      goto switchD_00165d06_caseD_4;
    case 5:
switchD_00165dd2_caseD_5:
      if (4 < channelIndex) goto LAB_00165f9c;
      goto LAB_00165ea8;
    case 6:
      if (5 < channelIndex) goto LAB_00165f9c;
      goto LAB_00165e16;
    case 7:
switchD_00165dd2_caseD_7:
      if (channelIndex < 7) {
        bVar2 = (byte)(channelIndex << 3);
        uVar4 = 0xc0b0a05040302;
        goto LAB_00165f94;
      }
      goto LAB_00165f9c;
    default:
switchD_00165dd2_default:
      if (channelIndex < 8) {
        bVar2 = (byte)(channelIndex << 3);
        uVar4 = 0xc0b070605040302;
        goto LAB_00165f94;
      }
      goto LAB_00165f9c;
    }
  case ma_standard_channel_map_vorbis:
    switch(channelCount) {
    case 1:
      goto switchD_00165dd2_caseD_1;
    case 2:
      goto switchD_00165dd2_caseD_2;
    case 3:
      if (2 < channelIndex) goto LAB_00165f9c;
      bVar2 = (byte)(channelIndex << 3);
      uVar3 = 0x30402;
      goto LAB_00165f53;
    case 4:
      goto switchD_00165d06_caseD_4;
    case 5:
      if (channelIndex < 5) {
        bVar2 = (byte)(channelIndex << 3);
        uVar4 = 0x706030402;
        goto LAB_00165f94;
      }
      goto LAB_00165f9c;
    case 6:
switchD_00165d06_caseD_6:
      if (channelIndex < 6) {
        bVar2 = (byte)(channelIndex << 3);
        uVar4 = 0x50706030402;
        goto LAB_00165f94;
      }
      goto LAB_00165f9c;
    case 7:
switchD_00165d06_caseD_7:
      if (channelIndex < 7) {
        bVar2 = (byte)(channelIndex << 3);
        uVar4 = 0x50a0c0b030402;
        goto LAB_00165f94;
      }
      goto LAB_00165f9c;
    default:
switchD_00165d06_default:
      if (channelIndex < 8) {
        bVar2 = (byte)(channelIndex << 3);
        uVar4 = 0x507060c0b030402;
        goto LAB_00165f94;
      }
      goto LAB_00165f9c;
    }
  case ma_standard_channel_map_sound4:
    switch(channelCount) {
    case 1:
      goto switchD_00165dd2_caseD_1;
    case 2:
      goto switchD_00165dd2_caseD_2;
    case 3:
      goto switchD_00165dd2_caseD_3;
    case 4:
      goto switchD_00165d06_caseD_4;
    case 5:
      goto switchD_00165dd2_caseD_5;
    case 6:
      goto switchD_00165d06_caseD_6;
    case 7:
      goto switchD_00165d06_caseD_7;
    default:
      goto switchD_00165d06_default;
    }
  case ma_standard_channel_map_sndio:
    switch(channelCount) {
    case 1:
      goto switchD_00165dd2_caseD_1;
    case 2:
switchD_00165da8_caseD_2:
      if (channelIndex == 0) {
        return '\x02';
      }
      if (channelIndex == 1) {
        return '\x03';
      }
LAB_00165efc:
      if (0x1f < channelIndex || channelCount < 7) {
        return '\0';
      }
      return cVar1 + '\x0e';
    case 3:
      goto switchD_00165da8_caseD_3;
    case 4:
      if (3 < channelIndex) goto LAB_00165efc;
      break;
    case 5:
      if (4 < channelIndex) goto LAB_00165efc;
      goto LAB_00165ebf;
    default:
      if (5 < channelIndex) goto LAB_00165efc;
      goto LAB_00165f5f;
    }
    goto LAB_00165ed6;
  default:
    switch(channelCount) {
    case 1:
      goto switchD_00165dd2_caseD_1;
    case 2:
      goto switchD_00165dd2_caseD_2;
    case 3:
      goto switchD_00165dd2_caseD_3;
    case 4:
      if (3 < channelIndex) goto LAB_00165f9c;
      goto LAB_00165f4b;
    case 5:
      goto switchD_00165dd2_caseD_5;
    case 6:
      if (channelIndex < 6) {
        bVar2 = (byte)(channelIndex << 3);
        uVar4 = 0xc0b05040302;
        goto LAB_00165f94;
      }
      goto LAB_00165f9c;
    case 7:
      goto switchD_00165dd2_caseD_7;
    default:
      goto switchD_00165dd2_default;
    }
  }
}

Assistant:

static ma_channel ma_channel_map_init_standard_channel(ma_standard_channel_map standardChannelMap, ma_uint32 channelCount, ma_uint32 channelIndex)
{
    if (channelCount == 0 || channelIndex >= channelCount) {
        return MA_CHANNEL_NONE;
    }

    switch (standardChannelMap)
    {
        case ma_standard_channel_map_alsa:
        {
            return ma_channel_map_init_standard_channel_alsa(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_rfc3551:
        {
            return ma_channel_map_init_standard_channel_rfc3551(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_flac:
        {
            return ma_channel_map_init_standard_channel_flac(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_vorbis:
        {
            return ma_channel_map_init_standard_channel_vorbis(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_sound4:
        {
            return ma_channel_map_init_standard_channel_sound4(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_sndio:
        {
            return ma_channel_map_init_standard_channel_sndio(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_microsoft: /* Also default. */
        /*case ma_standard_channel_map_default;*/
        default:
        {
            return ma_channel_map_init_standard_channel_microsoft(channelCount, channelIndex);
        } break;
    }
}